

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

void __thiscall
HighsSplitDeque::WorkerBunk::publishWork(WorkerBunk *this,HighsSplitDeque *localDeque)

{
  HighsSplitDeque *pHVar1;
  long in_RSI;
  int *in_RDI;
  uint32_t t;
  HighsSplitDeque *sleeper;
  HighsSplitDeque *in_stack_000000c0;
  HighsSplitDeque *in_stack_000000c8;
  WorkerBunk *in_stack_000000d0;
  HighsTask *in_stack_ffffffffffffff78;
  HighsSplitDeque *in_stack_ffffffffffffff80;
  HighsSplitDeque *in_stack_ffffffffffffff90;
  atomic<bool> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  HighsSplitDeque *local_48;
  
  local_48 = popSleeper(in_stack_000000d0,in_stack_000000c8);
  while( true ) {
    if (local_48 == (HighsSplitDeque *)0x0) {
      return;
    }
    in_stack_ffffffffffffffb4 =
         selfStealAndGetTail((HighsSplitDeque *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (in_stack_ffffffffffffffb4 == *(uint32_t *)(in_RSI + 0x24)) break;
    std::array<HighsTask,_8192UL>::operator[]
              ((array<HighsTask,_8192UL> *)in_stack_ffffffffffffff80,
               (size_type)in_stack_ffffffffffffff78);
    injectTaskAndNotify(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (in_stack_ffffffffffffffb4 == *(int *)(in_RSI + 0x24) - 1U) {
      if (*(int *)(in_RSI + 0x20) != *(int *)(in_RSI + 0x24)) {
        return;
      }
      *(undefined1 *)(in_RSI + 0x38) = 1;
      std::atomic<bool>::store
                (in_stack_ffffffffffffff98,SUB81((ulong)local_48 >> 0x38,0),(memory_order)local_48);
      LOCK();
      *in_RDI = *in_RDI + -1;
      UNLOCK();
      return;
    }
    pHVar1 = popSleeper(in_stack_000000d0,in_stack_000000c8);
    in_stack_ffffffffffffff90 = local_48;
    local_48 = pHVar1;
  }
  if (*(int *)(in_RSI + 0x20) == *(int *)(in_RSI + 0x24)) {
    *(undefined1 *)(in_RSI + 0x38) = 1;
    std::atomic<bool>::store
              (in_stack_ffffffffffffff98,SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0),
               (memory_order)in_stack_ffffffffffffff90);
    LOCK();
    *in_RDI = *in_RDI + -1;
    UNLOCK();
  }
  pushSleeper((WorkerBunk *)in_stack_000000c8,in_stack_000000c0);
  return;
}

Assistant:

void publishWork(HighsSplitDeque* localDeque) {
      HighsSplitDeque* sleeper = popSleeper(localDeque);
      while (sleeper) {
        uint32_t t = localDeque->selfStealAndGetTail();
        if (t == localDeque->ownerData.splitCopy) {
          if (localDeque->ownerData.head == localDeque->ownerData.splitCopy) {
            localDeque->ownerData.allStolenCopy = true;
            localDeque->stealerData.allStolen.store(true,
                                                    std::memory_order_relaxed);
            haveJobs.fetch_add(-1, std::memory_order_release);
          }
          pushSleeper(sleeper);
          return;
        } else {
          sleeper->injectTaskAndNotify(&localDeque->taskArray[t]);
        }

        if (t == localDeque->ownerData.splitCopy - 1) {
          if (localDeque->ownerData.head == localDeque->ownerData.splitCopy) {
            localDeque->ownerData.allStolenCopy = true;
            localDeque->stealerData.allStolen.store(true,
                                                    std::memory_order_relaxed);
            haveJobs.fetch_add(-1, std::memory_order_release);
          }
          return;
        }

        sleeper = popSleeper(localDeque);
      }
    }